

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::ReadMotion(BVHLoader *this,aiScene *param_1)

{
  bool bVar1;
  uint frame;
  uint uVar2;
  pointer pNVar3;
  uint c;
  ulong uVar4;
  pointer pNVar5;
  float fVar6;
  string tokenDuration1;
  string tokenDuration2;
  string tokenFrames;
  string sStack_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  float local_1a8 [94];
  
  GetNextToken_abi_cxx11_(&local_1e8,this);
  bVar1 = std::operator!=(&local_1e8,"Frames:");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,"Expected frame count \"Frames:\", but found \"");
    std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
    std::operator<<((ostream *)local_1a8,"\".");
    std::__cxx11::stringbuf::str();
    ThrowException(this,&sStack_228);
  }
  fVar6 = GetNextTokenAsFloat(this);
  this->mAnimNumFrames = (uint)(long)fVar6;
  GetNextToken_abi_cxx11_(&sStack_228,this);
  GetNextToken_abi_cxx11_(&local_208,this);
  bVar1 = std::operator!=(&sStack_228,"Frame");
  if (!bVar1) {
    bVar1 = std::operator!=(&local_208,"Time:");
    if (!bVar1) {
      fVar6 = GetNextTokenAsFloat(this);
      this->mAnimTickDuration = fVar6;
      for (pNVar5 = (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar5 != (this->mNodes).
                    super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pNVar5 = pNVar5 + 1) {
        std::vector<float,_std::allocator<float>_>::reserve
                  (&pNVar5->mChannelValues,
                   (ulong)this->mAnimNumFrames *
                   ((long)(pNVar5->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar5->mChannels).
                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      for (uVar2 = 0; uVar2 < this->mAnimNumFrames; uVar2 = uVar2 + 1) {
        for (pNVar3 = (this->mNodes).
                      super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start; pNVar3 != pNVar5;
            pNVar3 = pNVar3 + 1) {
          for (uVar4 = 0;
              uVar4 < (ulong)((long)(pNVar3->mChannels).
                                    super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pNVar3->mChannels).
                                    super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar4 = (ulong)((int)uVar4 + 1)) {
            local_1a8[0] = GetNextTokenAsFloat(this);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      (&pNVar3->mChannelValues,local_1a8);
          }
          pNVar5 = (this->mNodes).
                   super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&sStack_228);
      std::__cxx11::string::~string((string *)&local_1e8);
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Expected frame duration \"Frame Time:\", but found \"");
  std::operator<<((ostream *)local_1a8,(string *)&sStack_228);
  std::operator<<((ostream *)local_1a8," ");
  std::operator<<((ostream *)local_1a8,(string *)&local_208);
  std::operator<<((ostream *)local_1a8,"\".");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1c8);
}

Assistant:

void BVHLoader::ReadMotion( aiScene* /*pScene*/)
{
    // Read number of frames
    std::string tokenFrames = GetNextToken();
    if( tokenFrames != "Frames:")
        ThrowException( format() << "Expected frame count \"Frames:\", but found \"" << tokenFrames << "\".");

    float numFramesFloat = GetNextTokenAsFloat();
    mAnimNumFrames = (unsigned int) numFramesFloat;

    // Read frame duration
    std::string tokenDuration1 = GetNextToken();
    std::string tokenDuration2 = GetNextToken();
    if( tokenDuration1 != "Frame" || tokenDuration2 != "Time:")
        ThrowException( format() << "Expected frame duration \"Frame Time:\", but found \"" << tokenDuration1 << " " << tokenDuration2 << "\"." );

    mAnimTickDuration = GetNextTokenAsFloat();

    // resize value vectors for each node
    for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        it->mChannelValues.reserve( it->mChannels.size() * mAnimNumFrames);

    // now read all the data and store it in the corresponding node's value vector
    for( unsigned int frame = 0; frame < mAnimNumFrames; ++frame)
    {
        // on each line read the values for all nodes
        for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        {
            // get as many values as the node has channels
            for( unsigned int c = 0; c < it->mChannels.size(); ++c)
                it->mChannelValues.push_back( GetNextTokenAsFloat());
        }

        // after one frame worth of values for all nodes there should be a newline, but we better don't rely on it
    }
}